

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall Dumper::dumpNodeEdges(Dumper *this,RWNode *node)

{
  bool bVar1;
  int iVar2;
  iterator this_00;
  reference ppRVar3;
  reference this_01;
  RWSubgraph *pRVar4;
  RWNode *pRVar5;
  long in_RSI;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::dda::RWNode_*>,_bool> pVar6;
  RWSubgraph *s;
  RWCalledValue *cv;
  iterator __end2_2;
  iterator __begin2_2;
  CalleesT *__range2_2;
  RWNodeCall *C;
  RWNode *def_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range2_1;
  RWNode *def;
  iterator __end2;
  iterator __begin2;
  DefUses *__range2;
  vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *in_stack_ffffffffffffff28
  ;
  RWNodeCall *in_stack_ffffffffffffff30;
  LLVMDataDependenceAnalysis *in_stack_ffffffffffffff38;
  RWNodeCall *pRVar7;
  value_type *in_stack_ffffffffffffff48;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_ffffffffffffff50;
  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  local_a0;
  CalleesT *local_98;
  RWNodeCall *local_90;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_78;
  undefined1 local_70 [24];
  undefined1 *local_58;
  RWNode *local_50;
  RWNode **local_48;
  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_40;
  long local_38;
  _Base_ptr local_30;
  byte local_28;
  _Base_ptr local_20;
  byte local_18;
  long local_10;
  
  local_10 = in_RSI;
  if ((dumpNodeEdges(dg::dda::RWNode*)::dumped == '\0') &&
     (iVar2 = __cxa_guard_acquire(&dumpNodeEdges(dg::dda::RWNode*)::dumped), iVar2 != 0)) {
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
        0x17b20a);
    __cxa_atexit(std::
                 set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                 ::~set,&dumpNodeEdges::dumped,&__dso_handle);
    __cxa_guard_release(&dumpNodeEdges(dg::dda::RWNode*)::dumped);
  }
  pVar6 = std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          insert(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_30 = (_Base_ptr)pVar6.first._M_node;
  local_28 = pVar6.second;
  if (((local_28 ^ 0xff) & 1) == 0) {
    local_20 = local_30;
    local_18 = local_28;
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x17b298);
    if ((bVar1) || (bVar1 = dg::dda::RWNode::isPhi((RWNode *)in_stack_ffffffffffffff30), bVar1)) {
      local_38 = local_10 + 0x130;
      local_40._M_current =
           (RWNode **)dg::dda::RWNode::DefUses::begin((DefUses *)in_stack_ffffffffffffff28);
      local_48 = (RWNode **)dg::dda::RWNode::DefUses::end((DefUses *)in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        ppRVar3 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                  ::operator*(&local_40);
        local_50 = *ppRVar3;
        printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",local_50,local_10);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
        ::operator++(&local_40);
      }
    }
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x17b367);
    if ((!bVar1) && (bVar1 = dg::dda::RWNode::isUse((RWNode *)0x17b37c), bVar1)) {
      dg::dda::LLVMDataDependenceAnalysis::getDefinitions
                (in_stack_ffffffffffffff38,(RWNode *)in_stack_ffffffffffffff30);
      local_58 = local_70;
      local_78._M_current =
           (RWNode **)
           std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                     ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                      in_stack_ffffffffffffff28);
      this_00 = std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                          ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                           in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        ppRVar3 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                  ::operator*(&local_78);
        pRVar5 = *ppRVar3;
        nodeToDot((Dumper *)this_00._M_current,pRVar5);
        printf("\tNODE%p->NODE%p [style=dotted constraint=false color=blue]\n",pRVar5,local_10);
        __gnu_cxx::
        __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
        ::operator++(&local_78);
      }
      std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector(in_RDI);
    }
    local_90 = dg::dda::RWNodeCall::get((RWNode *)in_stack_ffffffffffffff30);
    if (local_90 != (RWNodeCall *)0x0) {
      local_98 = dg::dda::RWNodeCall::getCallees(local_90);
      local_a0._M_current =
           (RWCalledValue *)
           std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                     (in_stack_ffffffffffffff28);
      std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                (in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        this_01 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                  ::operator*(&local_a0);
        pRVar4 = dg::dda::RWCalledValue::getSubgraph(this_01);
        if (pRVar4 == (RWSubgraph *)0x0) {
          in_stack_ffffffffffffff30 = local_90;
          pRVar5 = dg::dda::RWCalledValue::getCalledValue(this_01);
          printf("\tNODE%p->NODE%p [style=dashed constraint=false color=blue]\n",
                 in_stack_ffffffffffffff30,pRVar5);
        }
        else {
          pRVar7 = local_90;
          pRVar5 = dg::dda::RWSubgraph::getRoot((RWSubgraph *)0x17b4d7);
          printf("\tNODE%p->NODE%p [penwidth=4 color=blue ltail=cluster_subg_%p]\n",pRVar7,pRVar5,
                 pRVar4);
        }
        __gnu_cxx::
        __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
        ::operator++(&local_a0);
      }
    }
  }
  return;
}

Assistant:

void dumpNodeEdges(RWNode *node) {
        static std::set<RWNode *> dumped;
        if (!dumped.insert(node).second)
            return;

        if (verbose || node->isPhi()) {
            for (RWNode *def : node->defuse) {
                printf("\tNODE%p->NODE%p [style=dotted constraint=false]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (!graph_only && node->isUse()) {
            for (RWNode *def : DDA->getDefinitions(node)) {
                nodeToDot(def);
                printf("\tNODE%p->NODE%p [style=dotted constraint=false "
                       "color=blue]\n",
                       static_cast<void *>(def), static_cast<void *>(node));
            }
        }
        if (auto *C = RWNodeCall::get(node)) {
            for (auto &cv : C->getCallees()) {
                if (auto *s = cv.getSubgraph()) {
                    assert(s->getRoot() && "Subgraph has no root");
                    printf("\tNODE%p->NODE%p "
                           "[penwidth=4 color=blue "
                           "ltail=cluster_subg_%p]\n",
                           static_cast<void *>(C),
                           static_cast<const void *>(s->getRoot()), s);
                } else {
                    printf("\tNODE%p->NODE%p [style=dashed constraint=false "
                           "color=blue]\n",
                           static_cast<void *>(C),
                           static_cast<void *>(cv.getCalledValue()));
                }
            }
        }
    }